

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_MOVA(Context *ctx)

{
  int iVar1;
  int iVar2;
  size_t in_RCX;
  char *pcVar3;
  char *fmt;
  char addr [32];
  char scratch [64];
  char src0 [64];
  char acStack_b8 [32];
  char local_98 [64];
  char local_58 [72];
  
  if (ctx->profile_supports_nv4 == 0) {
    if ((ctx->profile_supports_nv2 == 0) && (ctx->profile_supports_nv3 == 0)) {
      make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_58,in_RCX);
      iVar1 = ctx->scratch_registers;
      iVar2 = iVar1 + 1;
      ctx->scratch_registers = iVar2;
      if (ctx->max_scratch_registers <= iVar1) {
        ctx->max_scratch_registers = iVar2;
      }
      snprintf(local_98,0x40,"scratch%d");
      snprintf(acStack_b8,0x20,"addr%d",(ulong)(uint)(ctx->dest_arg).regnum);
      if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
        fmt = "CMP %s, %s, -1.0, 1.0;";
        pcVar3 = local_58;
      }
      else {
        pcVar3 = local_98;
        output_line(ctx,"SLT %s, %s, 0.0;",pcVar3,local_58);
        fmt = "MAD %s, %s, -2.0, 1.0;";
      }
      output_line(ctx,fmt,local_98,pcVar3);
      output_line(ctx,"ABS %s, %s;",acStack_b8,local_58);
      output_line(ctx,"ADD %s, %s, 0.5;",acStack_b8,acStack_b8);
      output_line(ctx,"FLR %s, %s;",acStack_b8,acStack_b8);
      output_line(ctx,"MUL %s, %s, %s;",acStack_b8,acStack_b8,local_98);
      if ((ctx->dest_arg).result_mod == 0) {
        if ((ctx->dest_arg).result_shift == 0) {
          ctx->last_address_reg_component = -1;
          return;
        }
        __assert_fail("ctx->dest_arg.result_shift == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1f38,"void emit_ARB1_MOVA(Context *)");
      }
      __assert_fail("ctx->dest_arg.result_mod == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1f37,"void emit_ARB1_MOVA(Context *)");
    }
    pcVar3 = "ARR";
  }
  else {
    pcVar3 = "ROUND.S";
  }
  emit_ARB1_opcode_ds(ctx,pcVar3);
  return;
}

Assistant:

static void emit_ARB1_MOVA(Context *ctx)
{
    // nv2 and nv3 can use the ARR opcode.
    // But nv4 removed ARR (and ADDRESS registers!). Just ROUND to an INT.
    if (support_nv4(ctx))
        emit_ARB1_opcode_ds(ctx, "ROUND.S");  // !!! FIXME: don't use a modifier here.
    else if ((support_nv2(ctx)) || (support_nv3(ctx)))
        emit_ARB1_opcode_ds(ctx, "ARR");
    else
    {
        char src0[64];
        char scratch[64];
        char addr[32];

        make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        allocate_ARB1_scratch_reg_name(ctx, scratch, sizeof (scratch));
        snprintf(addr, sizeof (addr), "addr%d", ctx->dest_arg.regnum);

        // !!! FIXME: we can optimize this if src_mod is ABS or ABSNEGATE.

        // ARL uses floor(), but D3D expects round-to-nearest.
        // There is probably a more efficient way to do this.
        if (shader_is_pixel(ctx))  // CMP only exists in fragment programs.  :/
            output_line(ctx, "CMP %s, %s, -1.0, 1.0;", scratch, src0);
        else
        {
            output_line(ctx, "SLT %s, %s, 0.0;", scratch, src0);
            output_line(ctx, "MAD %s, %s, -2.0, 1.0;", scratch, scratch);
        } // else

        output_line(ctx, "ABS %s, %s;", addr, src0);
        output_line(ctx, "ADD %s, %s, 0.5;", addr, addr);
        output_line(ctx, "FLR %s, %s;", addr, addr);
        output_line(ctx, "MUL %s, %s, %s;", addr, addr, scratch);

        // we don't handle these right now, since emit_ARB1_dest_modifiers(ctx)
        //  wants to look at dest_arg, not our temp register.
        assert(ctx->dest_arg.result_mod == 0);
        assert(ctx->dest_arg.result_shift == 0);

        // we assign to the actual address register as needed.
        ctx->last_address_reg_component = -1;
    } // else
}